

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_theta(uint64_t *A)

{
  ulong local_78;
  uint64_t D [5];
  ulong local_48;
  uint64_t C [5];
  uint local_14;
  uint x;
  uint64_t *A_local;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    C[(ulong)local_14 - 1] =
         A[local_14] ^ A[local_14 + 5] ^ A[local_14 + 10] ^ A[local_14 + 0xf] ^ A[local_14 + 0x14];
  }
  D[0] = C[1] << 1 ^ C[1] >> 0x3f ^ local_48;
  D[1] = C[2] << 1 ^ C[2] >> 0x3f ^ C[0];
  D[2] = C[3] << 1 ^ C[3] >> 0x3f ^ C[1];
  D[3] = local_48 << 1 ^ local_48 >> 0x3f ^ C[2];
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    A[local_14] = D[(ulong)local_14 - 1] ^ A[local_14];
    A[local_14 + 5] = D[(ulong)local_14 - 1] ^ A[local_14 + 5];
    A[local_14 + 10] = D[(ulong)local_14 - 1] ^ A[local_14 + 10];
    A[local_14 + 0xf] = D[(ulong)local_14 - 1] ^ A[local_14 + 0xf];
    A[local_14 + 0x14] = D[(ulong)local_14 - 1] ^ A[local_14 + 0x14];
  }
  return;
}

Assistant:

static void keccak_theta(uint64_t *A)
{
	unsigned int x;
	uint64_t C[5], D[5];

	for (x = 0; x < 5; x++) {
		C[x] = A[x] ^ A[x + 5] ^ A[x + 10] ^ A[x + 15] ^ A[x + 20];
	}
	D[0] = ROTL64(C[1], 1) ^ C[4];
	D[1] = ROTL64(C[2], 1) ^ C[0];
	D[2] = ROTL64(C[3], 1) ^ C[1];
	D[3] = ROTL64(C[4], 1) ^ C[2];
	D[4] = ROTL64(C[0], 1) ^ C[3];

	for (x = 0; x < 5; x++) {
		A[x]      ^= D[x];
		A[x + 5]  ^= D[x];
		A[x + 10] ^= D[x];
		A[x + 15] ^= D[x];
		A[x + 20] ^= D[x];
	}
}